

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_decoder.cc
# Opt level: O2

Status * __thiscall
draco::PlyDecoder::DecodeFaceData
          (Status *__return_storage_ptr__,PlyDecoder *this,PlyElement *face_element)

{
  function<unsigned_int_(int)> *this_00;
  long lVar1;
  pointer plVar2;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar3;
  uint uVar4;
  PlyProperty *property;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ThisIndexType ret;
  FaceIndex face_id;
  size_t num_faces;
  int64_t ti;
  long lVar8;
  int64_t c;
  long lVar9;
  Face face;
  PlyPropertyReader<unsigned_int> vertex_index_reader;
  
  if (face_element == (PlyElement *)0x0) {
    __return_storage_ptr__->code_ = OK;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    (__return_storage_ptr__->error_msg_)._M_string_length = 0;
    (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertex_index_reader,"vertex_indices",(allocator<char> *)&face);
  property = PlyElement::GetPropertyByName(face_element,(string *)&vertex_index_reader);
  std::__cxx11::string::~string((string *)&vertex_index_reader);
  if (property == (PlyProperty *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vertex_index_reader,"vertex_index",(allocator<char> *)&face);
    property = PlyElement::GetPropertyByName(face_element,(string *)&vertex_index_reader);
    std::__cxx11::string::~string((string *)&vertex_index_reader);
    if (property == (PlyProperty *)0x0) goto LAB_0011758d;
  }
  if (property->list_data_type_ != DT_INVALID) {
    uVar4 = (uint)face_element->num_entries_;
    uVar6 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar6;
    }
    num_faces = 0;
    for (; uVar5 * 0x10 != uVar6; uVar6 = uVar6 + 0x10) {
      lVar1 = *(long *)((long)(property->list_data_).super__Vector_base<long,_std::allocator<long>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar6 + 8);
      lVar7 = 0;
      if (2 < lVar1) {
        lVar7 = lVar1 + -2;
      }
      num_faces = num_faces + lVar7;
    }
    Mesh::SetNumFaces(this->out_mesh_,num_faces);
    uVar4 = (uint)face_element->num_entries_;
    PlyPropertyReader<unsigned_int>::PlyPropertyReader(&vertex_index_reader,property);
    face._M_elems[2].value_ = 0;
    face._M_elems[0].value_ = 0;
    face._M_elems[1].value_ = 0;
    this_00 = &vertex_index_reader.convert_value_func_;
    uVar6 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar6;
    }
    face_id.value_ = 0;
    for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
      plVar2 = (property->list_data_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar1 = plVar2[uVar6 * 2 + 1];
      if (2 < lVar1) {
        lVar7 = plVar2[uVar6 * 2];
        IVar3.value_ = std::function<unsigned_int_(int)>::operator()(this_00,(int)lVar7);
        face._M_elems[0].value_ = IVar3.value_;
        for (lVar8 = 0; lVar8 != lVar1 + -2; lVar8 = lVar8 + 1) {
          for (lVar9 = 1; lVar9 != 3; lVar9 = lVar9 + 1) {
            uVar4 = std::function<unsigned_int_(int)>::operator()(this_00,(int)lVar7 + (int)lVar9);
            face._M_elems[lVar9].value_ = uVar4;
          }
          Mesh::SetFace(this->out_mesh_,face_id,&face);
          face_id.value_ = face_id.value_ + 1;
          lVar7 = lVar7 + 1;
        }
      }
    }
    Mesh::SetNumFaces(this->out_mesh_,(ulong)face_id.value_);
    __return_storage_ptr__->code_ = OK;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    (__return_storage_ptr__->error_msg_)._M_string_length = 0;
    (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
    std::_Function_base::~_Function_base(&this_00->super__Function_base);
    return __return_storage_ptr__;
  }
LAB_0011758d:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertex_index_reader,"No faces defined",(allocator<char> *)&face);
  __return_storage_ptr__->code_ = DRACO_ERROR;
  std::__cxx11::string::string
            ((string *)&__return_storage_ptr__->error_msg_,(string *)&vertex_index_reader);
  std::__cxx11::string::~string((string *)&vertex_index_reader);
  return __return_storage_ptr__;
}

Assistant:

Status PlyDecoder::DecodeFaceData(const PlyElement *face_element) {
  // We accept point clouds now.
  if (face_element == nullptr) {
    return OkStatus();
  }
  const PlyProperty *vertex_indices =
      face_element->GetPropertyByName("vertex_indices");
  if (vertex_indices == nullptr) {
    // The property name may be named either "vertex_indices" or "vertex_index".
    vertex_indices = face_element->GetPropertyByName("vertex_index");
  }
  if (vertex_indices == nullptr || !vertex_indices->is_list()) {
    return Status(Status::DRACO_ERROR, "No faces defined");
  }

  // Allocate faces.
  out_mesh_->SetNumFaces(CountNumTriangles(*face_element, *vertex_indices));
  const int64_t num_polygons = face_element->num_entries();

  PlyPropertyReader<PointIndex::ValueType> vertex_index_reader(vertex_indices);
  Mesh::Face face;
  FaceIndex face_index(0);
  for (int i = 0; i < num_polygons; ++i) {
    const int64_t list_offset = vertex_indices->GetListEntryOffset(i);
    const int64_t list_size = vertex_indices->GetListEntryNumValues(i);
    if (list_size < 3) {
      continue;  // All invalid polygons are skipped.
    }

    // Triangulate polygon assuming the polygon is convex.
    const int64_t num_triangles = list_size - 2;
    face[0] = vertex_index_reader.ReadValue(static_cast<int>(list_offset));
    for (int64_t ti = 0; ti < num_triangles; ++ti) {
      for (int64_t c = 1; c < 3; ++c) {
        face[c] = vertex_index_reader.ReadValue(
            static_cast<int>(list_offset + ti + c));
      }
      out_mesh_->SetFace(face_index, face);
      face_index++;
    }
  }
  out_mesh_->SetNumFaces(face_index.value());
  return OkStatus();
}